

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVectorTests.cpp
# Opt level: O0

void (anonymous_namespace)::
     assertValuesInOrder<slang::SmallVector<(anonymous_namespace)::Constructable,5ul>,int,int,int>
               (SmallVector<(anonymous_namespace)::Constructable,_5UL> *v,int *args,int *args_1,
               int *args_2)

{
  StringRef capturedExpression;
  StringRef macroName;
  bool bVar1;
  ExprLhs<bool> EVar2;
  undefined4 *in_RCX;
  undefined4 *in_RDX;
  undefined4 *in_RSI;
  undefined8 in_RDI;
  AssertionHandler catchAssertionHandler;
  array<int,_3UL> a;
  undefined4 in_stack_ffffffffffffff18;
  undefined4 uVar3;
  undefined4 in_stack_ffffffffffffff1c;
  undefined7 in_stack_ffffffffffffff20;
  undefined1 in_stack_ffffffffffffff27;
  SourceLineInfo *this;
  undefined4 in_stack_ffffffffffffff30;
  undefined4 uVar4;
  undefined4 in_stack_ffffffffffffff34;
  char *in_stack_ffffffffffffff38;
  size_type in_stack_ffffffffffffff40;
  Flags in_stack_ffffffffffffff50;
  SourceLineInfo local_98;
  StringRef local_88;
  undefined4 local_2c;
  undefined4 local_28;
  undefined4 local_24;
  undefined8 local_8;
  
  local_2c = *in_RSI;
  local_28 = *in_RDX;
  local_24 = *in_RCX;
  local_8 = in_RDI;
  local_88 = operator____catch_sr
                       ((char *)CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20),
                        CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
  this = &local_98;
  Catch::SourceLineInfo::SourceLineInfo
            (this,
             "/workspace/llm4binary/github/license_c_cmakelists/MikePopoloski[P]slang/tests/unittests/util/SmallVectorTests.cpp"
             ,0x6b);
  operator____catch_sr
            ((char *)CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20),
             CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
  uVar3 = 2;
  macroName.m_size = in_stack_ffffffffffffff40;
  macroName.m_start = in_stack_ffffffffffffff38;
  capturedExpression.m_size._0_4_ = in_stack_ffffffffffffff30;
  capturedExpression.m_start = (char *)this;
  capturedExpression.m_size._4_4_ = in_stack_ffffffffffffff34;
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20),
             macroName,(SourceLineInfo *)CONCAT44(in_stack_ffffffffffffff1c,2),capturedExpression,
             in_stack_ffffffffffffff50);
  bVar1 = std::ranges::__equal_fn::
          operator()<slang::SmallVector<(anonymous_namespace)::Constructable,_5UL>_&,_std::array<int,_3UL>_&,_std::ranges::equal_to,_int_((anonymous_namespace)::Constructable::*)()_const,_std::identity>
                    ((__equal_fn *)&std::ranges::equal,local_8,&local_2c,
                     anon_unknown.dwarf_70180c::Constructable::getValue,0);
  uVar4 = CONCAT13(bVar1,(int3)in_stack_ffffffffffffff30);
  EVar2 = Catch::operator<=<bool,_0>((Decomposer *)CONCAT44(in_stack_ffffffffffffff1c,uVar3),false);
  Catch::AssertionHandler::handleExpr<bool>
            ((AssertionHandler *)CONCAT44(in_stack_ffffffffffffff34,uVar4),(ExprLhs<bool> *)this);
  Catch::AssertionHandler::complete
            ((AssertionHandler *)CONCAT17(EVar2.m_lhs,in_stack_ffffffffffffff20));
  Catch::AssertionHandler::~AssertionHandler
            ((AssertionHandler *)CONCAT17(EVar2.m_lhs,in_stack_ffffffffffffff20));
  return;
}

Assistant:

void assertValuesInOrder(TVector& v, TArgs&&... args) {
    auto a = std::array{std::forward<TArgs>(args)...};
    CHECK(std::ranges::equal(v, a, {}, &Constructable::getValue));
}